

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O0

void __thiscall dynamicgraph::TracerRealTime::closeFiles(TracerRealTime *this)

{
  basic_ofstream<char,_std::char_traits<char>_> *this_00;
  bool bVar1;
  reference ppbVar2;
  reference ppbVar3;
  long *local_68;
  ofstream *hardFile;
  stringstream *file;
  _List_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*> local_28;
  iterator hardIter;
  iterator iter;
  lock_guard<std::mutex> files_lock;
  TracerRealTime *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&iter,(mutex_type *)&this->field_0xf0);
  hardIter._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ::begin((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                *)&this->field_0x190);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
       ::begin(&this->hardFiles);
  while( true ) {
    file = (stringstream *)
           std::__cxx11::
           list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           ::end((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  *)&this->field_0x190);
    bVar1 = std::operator!=((_Self *)&file,(_Self *)&hardIter);
    if (!bVar1) break;
    ppbVar2 = std::_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::operator*
                        ((_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)
                         &hardIter);
    if (*ppbVar2 == (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
      local_68 = (long *)0x0;
    }
    else {
      local_68 = (long *)__dynamic_cast(*ppbVar2,&std::ostream::typeinfo,
                                        &std::__cxx11::stringstream::typeinfo,0x10);
    }
    ppbVar3 = std::_List_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*>::operator*
                        (&local_28);
    this_00 = *ppbVar3;
    std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
    std::ofstream::close();
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
    if (this_00 != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
      (**(code **)(*(long *)this_00 + 8))();
    }
    std::_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::operator++
              ((_List_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)&hardIter);
    std::_List_iterator<std::basic_ofstream<char,_std::char_traits<char>_>_*>::operator++(&local_28)
    ;
  }
  std::__cxx11::
  list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ::clear((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
           *)&this->field_0x190);
  std::__cxx11::
  list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
  ::clear(&this->hardFiles);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&iter);
  return;
}

Assistant:

void TracerRealTime::closeFiles() {
  dgDEBUGIN(15);
  std::lock_guard<std::mutex> files_lock(files_mtx);

  FileList::iterator iter = files.begin();
  HardFileList::iterator hardIter = hardFiles.begin();

  while (files.end() != iter) {
    dgDEBUG(25) << "Close the files." << endl;

    std::stringstream *file = dynamic_cast<stringstream *>(*iter);
    std::ofstream *hardFile = *hardIter;

    (*hardFile) << flush;
    hardFile->close();
    delete file;
    delete hardFile;

    ++iter;
    ++hardIter;
  }

  dgDEBUG(25) << "Clear the lists." << endl;
  files.clear();
  hardFiles.clear();

  dgDEBUGOUT(15);
}